

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_stream_get_latency(cubeb_stream_conflict1 *stm,uint32_t *latency)

{
  int iVar1;
  undefined4 *in_RSI;
  long in_RDI;
  snd_pcm_sframes_t delay;
  undefined4 local_20 [2];
  undefined4 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar1 = (*cubeb_snd_pcm_delay)(*(snd_pcm_t **)(in_RDI + 0x38),(snd_pcm_sframes_t *)local_20);
  if (iVar1 == 0) {
    *local_18 = local_20[0];
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
alsa_stream_get_latency(cubeb_stream * stm, uint32_t * latency)
{
  snd_pcm_sframes_t delay;
  /* This function returns the delay in frames until a frame written using
     snd_pcm_writei is sent to the DAC. The DAC delay should be < 1ms anyways.
   */
  if (WRAP(snd_pcm_delay)(stm->pcm, &delay)) {
    return CUBEB_ERROR;
  }

  *latency = delay;

  return CUBEB_OK;
}